

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O0

int mbedtls_ssl_check_curve_tls_id(mbedtls_ssl_context *ssl,uint16_t tls_id)

{
  uint16_t *local_28;
  uint16_t *group_list;
  uint16_t tls_id_local;
  mbedtls_ssl_context *ssl_local;
  
  local_28 = (uint16_t *)mbedtls_ssl_get_groups(ssl);
  if (local_28 != (uint16_t *)0x0) {
    for (; *local_28 != 0; local_28 = local_28 + 1) {
      if (*local_28 == tls_id) {
        return 0;
      }
    }
  }
  return -1;
}

Assistant:

int mbedtls_ssl_check_curve_tls_id(const mbedtls_ssl_context *ssl, uint16_t tls_id)
{
    const uint16_t *group_list = mbedtls_ssl_get_groups(ssl);

    if (group_list == NULL) {
        return -1;
    }

    for (; *group_list != 0; group_list++) {
        if (*group_list == tls_id) {
            return 0;
        }
    }

    return -1;
}